

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

TestNode *
deqp::gls::Functional::ScissorTestInternal::createClearTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,Vec4 *scissorArea,
          deUint32 clearMode)

{
  ScissorCase *this;
  
  this = (ScissorCase *)operator_new(0x90);
  anon_unknown_0::ScissorCase::ScissorCase(this,testCtx,renderCtx,name,desc,scissorArea);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00c415c0;
  *(deUint32 *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = clearMode;
  return (TestNode *)this;
}

Assistant:

tcu::TestNode* createClearTest (tcu::TestContext&	testCtx,
								glu::RenderContext&	renderCtx,
								const char*			name,
								const char*			desc,
								const Vec4&			scissorArea,
								deUint32			clearMode)
{
	return new ScissorClearCase(testCtx, renderCtx, name, desc, scissorArea, clearMode);
}